

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

bool anon_unknown.dwarf_16af90::checkPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int lx,int rx,
               int ly,int ry,int width)

{
  uint *puVar1;
  ostream *poVar2;
  half **pphVar3;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  Array2D<Imath_3_2::half_*> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar5;
  int in_stack_00000008;
  uint i;
  int x;
  int y;
  undefined8 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  uint uVar6;
  uint local_34;
  int local_30;
  int local_2c;
  
  local_2c = in_R8D;
  do {
    local_30 = in_EDX;
    if (in_R9D < local_2c) {
      return true;
    }
    for (; local_30 <= in_ECX; local_30 = local_30 + 1) {
      local_34 = 0;
      while (uVar6 = local_34,
            puVar1 = Imf_3_2::Array2D<unsigned_int>::operator[](in_RDI,(long)local_2c),
            uVar6 < puVar1[local_30]) {
        Imf_3_2::Array2D<Imath_3_2::half_*>::operator[](in_RSI,(long)local_2c);
        in_stack_ffffffffffffffc0 =
             Imath_3_2::half::operator_cast_to_float
                       ((half *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
        Imath_3_2::half::half
                  ((half *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),
                   (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        fVar5 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
        if ((in_stack_ffffffffffffffc0 != fVar5) || (NAN(in_stack_ffffffffffffffc0) || NAN(fVar5)))
        {
          poVar2 = std::operator<<((ostream *)&std::cout,"value at ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
          poVar2 = std::operator<<(poVar2,", sample ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34);
          poVar2 = std::operator<<(poVar2,": ");
          pphVar3 = Imf_3_2::Array2D<Imath_3_2::half_*>::operator[](in_RSI,(long)local_2c);
          poVar2 = (ostream *)::operator<<(poVar2,(half)pphVar3[local_30][local_34]._h);
          poVar2 = std::operator<<(poVar2,", should be ");
          pvVar4 = (void *)std::ostream::operator<<
                                     (poVar2,(local_2c * in_stack_00000008 + local_30) % 0x801);
          pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
          return false;
        }
        local_34 = local_34 + 1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount,
    Array2D<T*>&           ph,
    int                    lx,
    int                    rx,
    int                    ly,
    int                    ry,
    int                    width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T> (((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i
                         << ": " << ph[y][x][i] << ", should be "
                         << (y * width + x) % 2049 << endl
                         << flush;
                    return false;
                }
            }
        }
    }

    return true;
}